

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

Chain __thiscall S2Polygon::Shape::chain(Shape *this,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  S2LogMessage SStack_18;
  
  if (i < (int)((ulong)((long)(this->polygon_->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->polygon_->loops_).
                             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    if (this->cumulative_edges_ == (int *)0x0) {
      uVar3 = 0;
      uVar2 = 0;
      if (0 < i) {
        uVar4 = 0;
        uVar2 = 0;
        do {
          uVar2 = uVar2 + *(int *)((long)(this->polygon_->loops_).
                                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                                         super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>
                                         ._M_t + 0xc);
          uVar4 = uVar4 + 1;
        } while ((uint)i != uVar4);
      }
      uVar1 = *(uint *)((long)(this->polygon_->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[i]._M_t.
                              super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 0xc
                       );
      if (uVar1 != 1) {
        uVar3 = (ulong)uVar1;
      }
    }
    else {
      uVar2 = this->cumulative_edges_[i];
      uVar3 = (ulong)*(uint *)((long)(this->polygon_->loops_).
                                     super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[i]._M_t.
                                     super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>.
                                     _M_t + 0xc);
    }
    return (Chain)((ulong)uVar2 | uVar3 << 0x20);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x5f1,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (i) < (Shape::num_chains()) ",0x2a);
  abort();
}

Assistant:

int S2Polygon::Shape::num_chains() const {
  return polygon_->num_loops();
}